

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O1

OrderQty * __thiscall Application::queryOrderQty(OrderQty *__return_storage_ptr__,Application *this)

{
  long in_RAX;
  ostream *poVar1;
  long value;
  
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"OrderQty: ",10);
  std::istream::_M_extract<long>(&std::cin);
  FIX::DoubleField::DoubleField(&__return_storage_ptr__->super_QtyField,0x26,(double)in_RAX,0);
  (__return_storage_ptr__->super_QtyField).super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_00162a30;
  return __return_storage_ptr__;
}

Assistant:

FIX::OrderQty Application::queryOrderQty() {
  long value;
  std::cout << std::endl << "OrderQty: ";
  std::cin >> value;
  return FIX::OrderQty(value);
}